

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccipher.t.c
# Opt level: O2

void test_cipher_caesar_with_data(void)

{
  FILE *pFVar1;
  char key [8];
  char result2 [20];
  char result [20];
  char text [20];
  cipher_data data2;
  cipher_data data;
  text_scorer scorer;
  
  pFVar1 = fopen("./english_quadgrams.txt","r");
  scorer_load_data(&scorer,pFVar1);
  builtin_strncpy(text,"AOPZPZHJHLZHYJPWOLY",0x14);
  data.key = key;
  data.use_autocrack = true;
  data.result = result;
  data.success = false;
  data.ct = text;
  data.scorer = &scorer;
  caesar_with_data(&data);
  UnityAssertEqualNumber(1,(ulong)data.success,(char *)0x0,0xa9,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualString("19",data.key,(char *)0x0,0xaa);
  UnityAssertEqualString("THISISACAESARCIPHER",data.result,(char *)0x0,0xab);
  data2.key = "19";
  data2.use_autocrack = false;
  data2.result = result2;
  data2.success = false;
  data2.ct = text;
  data2.scorer = &scorer;
  caesar_with_data(&data2);
  UnityAssertEqualNumber(1,(ulong)data2.success,(char *)0x0,0xbb,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualString("THISISACAESARCIPHER",data2.result,(char *)0x0,0xbc);
  return;
}

Assistant:

void test_cipher_caesar_with_data(void)
{
	// Load the quadgram data
	struct text_scorer scorer;
	scorer_load_data(&scorer, fopen("./english_quadgrams.txt", "r"));

	// Test autocrack

	char text[] = "AOPZPZHJHLZHYJPWOLY";
	char result[sizeof(text)];
	char key[8];

	struct cipher_data data = {
			.ct = text,
			.key = key,
			.use_autocrack = true,
			.scorer = &scorer,
			.result = result,
	};

	caesar_with_data(&data);

	TEST_ASSERT_EQUAL_INT(true, data.success);
	TEST_ASSERT_EQUAL_STRING("19", data.key);
	TEST_ASSERT_EQUAL_STRING("THISISACAESARCIPHER", data.result);

	// Test solve with key

	char result2[sizeof(text)];

	struct cipher_data data2 = {
			.ct = text,
			.key = "19",
			.use_autocrack = false,
			.scorer = &scorer,
			.result = result2,
	};

	caesar_with_data(&data2);

	TEST_ASSERT_EQUAL_INT(true, data2.success);
	TEST_ASSERT_EQUAL_STRING("THISISACAESARCIPHER", data2.result);
}